

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O2

int runtest(int i)

{
  int iVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  int iVar4;
  int iVar5;
  int extraout_EAX;
  char *filename;
  char *filename_00;
  char *pcVar6;
  ulong uVar7;
  char *__format;
  glob64_t local_78;
  
  iVar3 = nb_tests;
  iVar2 = nb_leaks;
  iVar1 = nb_errors;
  if ((tests_quiet == '\0') && (testDescriptions[i].desc != (char *)0x0)) {
    printf("## %s\n");
  }
  if (testDescriptions[i].in == (char *)0x0) {
    iVar4 = (*testDescriptions[i].func)
                      ((char *)0x0,(char *)0x0,(char *)0x0,testDescriptions[i].options);
    if (iVar4 != 0) {
      nb_errors = nb_errors + 1;
    }
  }
  else {
    local_78.gl_offs = 0;
    glob64(testDescriptions[i].in,8,(__errfunc *)0x0,&local_78);
    for (uVar7 = 0; uVar7 < local_78.gl_pathc; uVar7 = uVar7 + 1) {
      iVar4 = checkTestFile(local_78.gl_pathv[uVar7]);
      if (iVar4 != 0) {
        if (testDescriptions[i].suffix == (char *)0x0) {
          filename = (char *)0x0;
        }
        else {
          filename = resultFilename(local_78.gl_pathv[uVar7],testDescriptions[i].out,
                                    testDescriptions[i].suffix);
          if (filename == (char *)0x0) goto LAB_00102730;
        }
        if (testDescriptions[i].err == (char *)0x0) {
          filename_00 = (char *)0x0;
        }
        else {
          filename_00 = resultFilename(local_78.gl_pathv[uVar7],testDescriptions[i].out,
                                       testDescriptions[i].err);
          if (filename_00 == (char *)0x0) {
LAB_00102730:
            fwrite("Out of memory !\n",0x10,1,_stderr);
            fatalError();
          }
        }
        if ((filename == (char *)0x0) || (iVar4 = checkTestFile(filename), iVar4 != 0)) {
          if ((filename_00 != (char *)0x0) && (iVar4 = checkTestFile(filename_00), iVar4 == 0)) {
            __format = "Missing error file %s\n";
            pcVar6 = filename_00;
            goto LAB_00102696;
          }
          iVar4 = xmlMemUsed();
          iVar5 = (*testDescriptions[i].func)
                            (local_78.gl_pathv[uVar7],filename,filename_00,
                             testDescriptions[i].options | 0x10000);
          xmlResetLastError();
          if (iVar5 == 0) {
            iVar5 = xmlMemUsed();
            __stream = _stderr;
            if (iVar5 != iVar4) {
              pcVar6 = local_78.gl_pathv[uVar7];
              iVar5 = xmlMemUsed();
              fprintf(__stream,"File %s leaked %d bytes\n",pcVar6,(ulong)(uint)(iVar5 - iVar4));
              nb_leaks = nb_leaks + 1;
            }
          }
          else {
            fprintf(_stderr,"File %s generated an error\n",local_78.gl_pathv[uVar7]);
            nb_errors = nb_errors + 1;
          }
        }
        else {
          __format = "Missing result file %s\n";
          pcVar6 = filename;
LAB_00102696:
          fprintf(_stderr,__format,pcVar6);
        }
        free(filename);
        free(filename_00);
      }
    }
    globfree64(&local_78);
    iVar4 = extraout_EAX;
  }
  if (verbose == '\x01') {
    if (nb_leaks == iVar2 && nb_errors == iVar1) {
      iVar4 = printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar3));
    }
    else {
      iVar4 = printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar3),
                     (ulong)(uint)(nb_errors - iVar1),(ulong)(uint)(nb_leaks - iVar2));
    }
  }
  return iVar4;
}

Assistant:

static int
runtest(int i) {
    int ret = 0, res;
    int old_errors, old_tests, old_leaks;

    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    if ((tests_quiet == 0) && (testDescriptions[i].desc != NULL))
	printf("## %s\n", testDescriptions[i].desc);
    res = launchTests(&testDescriptions[i]);
    if (res != 0)
	ret++;
    if (verbose) {
	if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	    printf("Ran %d tests, no errors\n", nb_tests - old_tests);
	else
	    printf("Ran %d tests, %d errors, %d leaks\n",
		   nb_tests - old_tests,
		   nb_errors - old_errors,
		   nb_leaks - old_leaks);
    }
    return(ret);
}